

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlNameDefn.h
# Opt level: O1

void __thiscall GdlNameDefn::AddExtName(GdlNameDefn *this,utf16 wLangID,GdlExpression *pexp)

{
  GdlStringExpression *this_00;
  wstring stu;
  wstring local_b0;
  wstring local_90;
  GdlExtName local_70;
  
  this_00 = (GdlStringExpression *)
            __dynamic_cast(pexp,&GdlExpression::typeinfo,&GdlStringExpression::typeinfo,0);
  GdlStringExpression::ConvertToUnicode_abi_cxx11_(&local_90,this_00);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_b0,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  GdlExtName::GdlExtName(&local_70,&local_b0,wLangID);
  std::vector<GdlExtName,_std::allocator<GdlExtName>_>::emplace_back<GdlExtName>
            (&this->m_vextname,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70.m_stuName._M_dataplus._M_p != &local_70.m_stuName.field_2) {
    operator_delete(local_70.m_stuName._M_dataplus._M_p,
                    local_70.m_stuName.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p !=
      &local_70.super_GdlObject.m_lnf.m_staFile.field_2) {
    operator_delete(local_70.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p,
                    local_70.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void AddExtName(utf16 wLangID, GdlExpression * pexp)
	{
		GdlStringExpression * pexpString = dynamic_cast<GdlStringExpression*>(pexp);
		Assert(pexpString);

		std::wstring stu = pexpString->ConvertToUnicode();
		m_vextname.push_back(GdlExtName(stu, wLangID));
	}